

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_9d1d6::GraphEdgeClipper::EdgeChainOnLeft
          (GraphEdgeClipper *this,vector<int,_std::allocator<int>_> *a,EdgeId b_first,EdgeId b_last)

{
  int iVar1;
  Graph *pGVar2;
  const_reference pvVar3;
  Edge *pEVar4;
  reference __x;
  size_type sVar5;
  reference pvVar6;
  S2Point *a_00;
  S2Point *b;
  S2Point *c;
  double dVar7;
  int local_c4;
  double dStack_c0;
  int i_1;
  double sum;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  int local_8c;
  iterator iStack_88;
  int j;
  int *local_80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  const_iterator local_68;
  int *local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<int,_std::allocator<int>_> loop;
  EdgeId b_last_local;
  EdgeId b_first_local;
  vector<int,_std::allocator<int>_> *a_local;
  GraphEdgeClipper *this_local;
  
  loop.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = b_last;
  loop.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = b_first;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->rank_,
                      (long)loop.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
  local_3c = *pvVar3;
  while( true ) {
    iVar1 = local_3c;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->rank_,
                        (long)(EdgeId)loop.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
    if (*pvVar3 <= iVar1) break;
    pGVar2 = this->g_;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->order_,(long)local_3c);
    pEVar4 = S2Builder::Graph::edge(pGVar2,*pvVar3);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_38,&pEVar4->second);
    local_3c = local_3c + 1;
  }
  pEVar4 = S2Builder::Graph::edge
                     (this->g_,(EdgeId)loop.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
  iVar1 = pEVar4->second;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](a,0);
  if (iVar1 != *pvVar3) {
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_38);
    local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_38);
    std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_58,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_60)
    ;
  }
  local_70._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_38);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_68,
             &local_70);
  local_78._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(a);
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::end(a);
  iStack_88 = std::vector<int,std::allocator<int>>::
              insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)local_38,local_68,local_78,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         local_80);
  for (local_8c = 0; local_8c < 2; local_8c = local_8c + 1) {
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_38);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
               &local_a0);
    local_b0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_38);
    local_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_b0,(long)local_8c);
    __x = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_a8);
    std::vector<int,_std::allocator<int>_>::insert
              ((vector<int,_std::allocator<int>_> *)local_38,local_98,__x);
  }
  dStack_c0 = 0.0;
  local_c4 = 2;
  while( true ) {
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_38);
    if (sVar5 <= (ulong)(long)local_c4) break;
    pGVar2 = this->g_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)(local_c4 + -2));
    a_00 = S2Builder::Graph::vertex(pGVar2,*pvVar6);
    pGVar2 = this->g_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)(local_c4 + -1));
    b = S2Builder::Graph::vertex(pGVar2,*pvVar6);
    pGVar2 = this->g_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_c4);
    c = S2Builder::Graph::vertex(pGVar2,*pvVar6);
    dVar7 = S2::TurnAngle(a_00,b,c);
    dStack_c0 = dVar7 + dStack_c0;
    local_c4 = local_c4 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return 0.0 < dStack_c0;
}

Assistant:

bool GraphEdgeClipper::EdgeChainOnLeft(
    const vector<VertexId>& a, EdgeId b_first, EdgeId b_last) const {
  // Gather all the interior vertices of the B subchain.
  vector<VertexId> loop;
  for (int i = rank_[b_first]; i < rank_[b_last]; ++i) {
    loop.push_back(g_.edge(order_[i]).second);
  }
  // Possibly reverse the chain so that it forms a loop when "a" is appended.
  if (g_.edge(b_last).second != a[0]) std::reverse(loop.begin(), loop.end());
  loop.insert(loop.end(), a.begin(), a.end());
  // Duplicate the first two vertices to simplify vertex indexing.
  for (int j = 0; j < 2; j++) {
    loop.insert(loop.end(), *(loop.begin() + j));
  }
  // Now B is to the left of A if and only if the loop is counterclockwise.
  double sum = 0;
  for (int i = 2; i < loop.size(); ++i) {
    sum += S2::TurnAngle(g_.vertex(loop[i - 2]), g_.vertex(loop[i - 1]),
                         g_.vertex(loop[i]));
  }
  return sum > 0;
}